

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFEmitter.cpp
# Opt level: O0

void writeVariableSizedInteger(uint64_t Integer,size_t Size,raw_ostream *OS,bool IsLittleEndian)

{
  bool IsLittleEndian_local;
  raw_ostream *OS_local;
  size_t Size_local;
  uint64_t Integer_local;
  
  if (Size == 8) {
    writeInteger<unsigned_long>(Integer,OS,IsLittleEndian);
  }
  else if (Size == 4) {
    writeInteger<unsigned_int>((uint)Integer,OS,IsLittleEndian);
  }
  else if (Size == 2) {
    writeInteger<unsigned_short>((unsigned_short)Integer,OS,IsLittleEndian);
  }
  else {
    if (Size != 1) {
      __assert_fail("false && \"Invalid integer write size.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFEmitter.cpp"
                    ,0x37,"void writeVariableSizedInteger(uint64_t, size_t, raw_ostream &, bool)");
    }
    writeInteger<unsigned_char>((uchar)Integer,OS,IsLittleEndian);
  }
  return;
}

Assistant:

static void writeVariableSizedInteger(uint64_t Integer, size_t Size,
                                      raw_ostream &OS, bool IsLittleEndian) {
  if (8 == Size)
    writeInteger((uint64_t)Integer, OS, IsLittleEndian);
  else if (4 == Size)
    writeInteger((uint32_t)Integer, OS, IsLittleEndian);
  else if (2 == Size)
    writeInteger((uint16_t)Integer, OS, IsLittleEndian);
  else if (1 == Size)
    writeInteger((uint8_t)Integer, OS, IsLittleEndian);
  else
    assert(false && "Invalid integer write size.");
}